

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.hpp
# Opt level: O1

void __thiscall Flag::Flag<char_const*,char_const*>(Flag *this,char *identifier,char *identifier_1)

{
  long lVar1;
  long *plVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_63;
  allocator<char> local_62;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [16];
  long local_30 [2];
  
  (this->super_Switch)._vptr_Switch = (_func_int **)&PTR_identifiers_abi_cxx11__0010d9c8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,identifier,&local_61);
  std::__cxx11::string::string<std::allocator<char>>(local_40,identifier_1,&local_62);
  __l._M_len = 2;
  __l._M_array = &local_60;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ids,__l,&local_63);
  lVar1 = -0x40;
  plVar2 = local_30;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  return;
}

Assistant:

explicit Flag(const T ...identifier) : ids { identifier... } {
        static_assert(sizeof...(T) >= 1, "At least one identifier must be provided");
    }